

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

xmlSaveCtxtPtr xmlSaveToFd(int fd,char *encoding,int options)

{
  xmlOutputBufferPtr pxVar1;
  xmlSaveCtxtPtr ret;
  int options_local;
  char *encoding_local;
  xmlSaveCtxtPtr pxStack_10;
  int fd_local;
  
  pxStack_10 = xmlNewSaveCtxt(encoding,options);
  if (pxStack_10 == (xmlSaveCtxtPtr)0x0) {
    pxStack_10 = (xmlSaveCtxtPtr)0x0;
  }
  else {
    pxVar1 = xmlOutputBufferCreateFd(fd,pxStack_10->handler);
    pxStack_10->buf = pxVar1;
    if (pxStack_10->buf == (xmlOutputBufferPtr)0x0) {
      xmlCharEncCloseFunc(pxStack_10->handler);
      xmlFreeSaveCtxt(pxStack_10);
      pxStack_10 = (xmlSaveCtxtPtr)0x0;
    }
  }
  return pxStack_10;
}

Assistant:

xmlSaveCtxtPtr
xmlSaveToFd(int fd, const char *encoding, int options)
{
    xmlSaveCtxtPtr ret;

    ret = xmlNewSaveCtxt(encoding, options);
    if (ret == NULL) return(NULL);
    ret->buf = xmlOutputBufferCreateFd(fd, ret->handler);
    if (ret->buf == NULL) {
        xmlCharEncCloseFunc(ret->handler);
	xmlFreeSaveCtxt(ret);
	return(NULL);
    }
    return(ret);
}